

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChContactTriangleXYZROT::ContactForceLoadResidual_F
          (ChContactTriangleXYZROT *this,ChVector<double> *F,ChVector<double> *abs_point,
          ChVectorDynamic<> *R)

{
  double *pdVar1;
  element_type *peVar2;
  double *pdVar3;
  double dVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  bool is_into;
  double s3;
  double s2;
  ChVector<double> local_58;
  ChVector<double> local_38;
  
  local_58.m_data[0] = abs_point->m_data[0];
  local_58.m_data[1] = abs_point->m_data[1];
  local_58.m_data[2] = abs_point->m_data[2];
  local_38.m_data[2] = 0.0;
  local_38.m_data[0] = 0.0;
  local_38.m_data[1] = 0.0;
  collision::utils::PointTriangleDistance
            (&local_58,
             (ChVector<double> *)
             &(((this->mnode1).
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_ChNodeFEAbase).field_0x20,
             (ChVector<double> *)
             &(((this->mnode2).
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_ChNodeFEAbase).field_0x20,
             (ChVector<double> *)
             &(((this->mnode3).
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_ChNodeFEAbase).field_0x20,&s2,&s3,&is_into,&local_38);
  peVar2 = (this->mnode1).
           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar8 = (ulong)*(uint *)((long)&(peVar2->super_ChNodeFEAbase).m_TotalMass +
                          (long)((peVar2->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[-3] + 4));
  lVar5 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3;
  if (lVar5 < (long)uVar8) goto LAB_0062b0d0;
  pdVar3 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  uVar6 = 3;
  dVar4 = (1.0 - s2) - s3;
  pdVar1 = pdVar3 + uVar8;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_0062afa2;
  }
  else {
LAB_0062afa2:
    uVar8 = 0;
    do {
      pdVar1[uVar8] = dVar4 * F->m_data[uVar8] + pdVar1[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (uVar6 < 3) {
    do {
      pdVar1[uVar6] = dVar4 * F->m_data[uVar6] + pdVar1[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  peVar2 = (this->mnode2).
           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar8 = (ulong)*(uint *)((long)&(peVar2->super_ChNodeFEAbase).m_TotalMass +
                          (long)((peVar2->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[-3] + 4));
  if (lVar5 < (long)uVar8) goto LAB_0062b0d0;
  pdVar1 = pdVar3 + uVar8;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_0062b01b;
  }
  else {
LAB_0062b01b:
    uVar6 = 0;
    do {
      pdVar1[uVar6] = s2 * F->m_data[uVar6] + pdVar1[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar8 != uVar6);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = s2 * F->m_data[uVar8] + pdVar1[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  peVar2 = (this->mnode3).
           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar8 = (ulong)*(uint *)((long)&(peVar2->super_ChNodeFEAbase).m_TotalMass +
                          (long)((peVar2->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[-3] + 4));
  if (lVar5 < (long)uVar8) {
LAB_0062b0d0:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  pdVar3 = pdVar3 + uVar8;
  uVar8 = 3;
  if (((ulong)pdVar3 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 == 0) goto LAB_0062b0a8;
  }
  uVar6 = 0;
  do {
    pdVar3[uVar6] = s3 * F->m_data[uVar6] + pdVar3[uVar6];
    uVar6 = uVar6 + 1;
  } while (uVar8 != uVar6);
LAB_0062b0a8:
  if (uVar8 < 3) {
    do {
      pdVar3[uVar8] = s3 * F->m_data[uVar8] + pdVar3[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  return;
}

Assistant:

void ChContactTriangleXYZROT::ContactForceLoadResidual_F(const ChVector<>& F,
                                                         const ChVector<>& abs_point,
                                                         ChVectorDynamic<>& R) {
    double s2, s3;
    ComputeUVfromP(abs_point, s2, s3);
    double s1 = 1 - s2 - s3;
    R.segment(mnode1->NodeGetOffset_w(), 3) += F.eigen() * s1;
    R.segment(mnode2->NodeGetOffset_w(), 3) += F.eigen() * s2;
    R.segment(mnode3->NodeGetOffset_w(), 3) += F.eigen() * s3;
}